

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteF64
          (BinaryWriterSpec *this,uint64_t f64_bits,ExpectedNan expected)

{
  char *format;
  
  if (expected == Arithmetic) {
    format = "\"%s\"";
    f64_bits = (uint64_t)"nan:arithmetic";
  }
  else if (expected == Canonical) {
    format = "\"%s\"";
    f64_bits = (uint64_t)"nan:canonical";
  }
  else {
    if (expected != None) {
      return;
    }
    format = "\"%lu\"";
  }
  Stream::Writef((Stream *)this,format,f64_bits);
  return;
}

Assistant:

void BinaryWriterSpec::WriteF64(uint64_t f64_bits, ExpectedNan expected) {
  switch (expected) {
    case ExpectedNan::None:
      json_stream_->Writef("\"%" PRIu64 "\"", f64_bits);
      break;

    case ExpectedNan::Arithmetic:
      WriteString("nan:arithmetic");
      break;

    case ExpectedNan::Canonical:
      WriteString("nan:canonical");
      break;
  }
}